

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_parsecfg.c
# Opt level: O2

int parseconfig(char *filename,GlobalConfig *global)

{
  ulong uVar1;
  char cVar2;
  int iVar3;
  ParameterError res;
  OperationConfig *__s;
  size_t sVar4;
  FILE *__stream;
  char *pcVar5;
  size_t sVar6;
  byte *pbVar7;
  ulong uVar8;
  byte *pbVar9;
  OperationConfig *pOVar10;
  byte bVar11;
  OperationConfig *in_RCX;
  byte *__s_00;
  byte *pbVar12;
  byte *pbVar13;
  _Bool usedarg;
  OperationConfig *local_1268;
  uint local_125c;
  char *local_1258;
  ulong local_1250;
  FILE *local_1248;
  OperationConfig *local_1240;
  char filebuffer [512];
  char local_1038 [4104];
  
  usedarg = false;
  pOVar10 = global->first;
  if ((filename == (char *)0x0) || (cVar2 = *filename, cVar2 == '\0')) {
    __s = (OperationConfig *)homedir();
    if (__s == (OperationConfig *)0x0) {
      filename = ".curlrc";
    }
    else {
      sVar4 = strlen((char *)__s);
      if (sVar4 < 0x1f9) {
        filename = filebuffer;
        in_RCX = __s;
        curl_msnprintf(filename,0x200,"%s%s%s",__s,"/",".curlrc");
      }
      else {
        filename = ".curlrc";
      }
      free(__s);
    }
    cVar2 = *filename;
  }
  if ((cVar2 != '-') || (__stream = _stdin, filename[1] != '\0')) {
    __stream = fopen64(filename,"r");
  }
  if (__stream == (FILE *)0x0) {
    return 1;
  }
  local_125c = 0;
  local_1268 = pOVar10;
  local_1258 = filename;
LAB_00118825:
  __s_00 = (byte *)0x0;
  do {
    pcVar5 = fgets(local_1038,0x1000,__stream);
    if (pcVar5 == (char *)0x0) {
      if (__s_00 != (byte *)0x0) goto LAB_001188be;
LAB_00118c1e:
      iVar3 = 0;
      goto LAB_00118c20;
    }
    if (__s_00 == (byte *)0x0) {
      pbVar7 = (byte *)strdup(local_1038);
      if (pbVar7 == (byte *)0x0) goto LAB_00118c1e;
    }
    else {
      sVar4 = strlen((char *)__s_00);
      sVar6 = strlen(local_1038);
      pbVar7 = (byte *)realloc(__s_00,sVar4 + sVar6 + 1);
      if (pbVar7 == (byte *)0x0) {
        free(__s_00);
        goto LAB_00118c1e;
      }
      strcpy((char *)(pbVar7 + sVar4),local_1038);
    }
    pcVar5 = strchr((char *)pbVar7,10);
    __s_00 = pbVar7;
  } while (pcVar5 == (char *)0x0);
  *pcVar5 = '\0';
LAB_001188be:
  local_125c = local_125c + 1;
  for (pbVar7 = __s_00; *pbVar7 != 0; pbVar7 = pbVar7 + 1) {
    iVar3 = Curl_isspace((uint)*pbVar7);
    if (iVar3 == 0) {
      bVar11 = *pbVar7;
      uVar8 = (ulong)bVar11;
      pbVar13 = pbVar7;
      uVar1 = uVar8;
      pOVar10 = (OperationConfig *)global;
      if ((0x2f < uVar8) ||
         (pOVar10 = (OperationConfig *)global, (0x840800002401U >> (uVar8 & 0x3f) & 1) == 0))
      goto LAB_00118911;
      break;
    }
  }
  goto LAB_001188f5;
LAB_00118911:
  local_1240 = pOVar10;
  local_1250 = uVar1;
  pbVar12 = pbVar13;
  if ((char)uVar8 == '\0') goto LAB_00118954;
  iVar3 = Curl_isspace((int)uVar8);
  if (iVar3 != 0) {
    if (*pbVar13 != 0) {
LAB_00118947:
      *pbVar13 = 0;
      pbVar13 = pbVar13 + 1;
      pbVar12 = pbVar13;
    }
    goto LAB_00118954;
  }
  if ((bVar11 != 0x2d) && ((*pbVar13 == 0x3a || (*pbVar13 == 0x3d)))) goto LAB_00118947;
  uVar8 = (ulong)pbVar13[1];
  pbVar13 = pbVar13 + 1;
  uVar1 = local_1250;
  pOVar10 = local_1240;
  goto LAB_00118911;
LAB_00118954:
  pbVar12 = pbVar12 + 1;
  pbVar9 = pbVar13;
  if (*pbVar13 == 0) goto LAB_00118986;
  iVar3 = Curl_isspace((uint)*pbVar13);
  pOVar10 = in_RCX;
  if (iVar3 == 0) {
    bVar11 = *pbVar13;
    pOVar10 = (OperationConfig *)(ulong)bVar11;
    if (((char)local_1250 == '-') || ((bVar11 != 0x3d && (in_RCX = pOVar10, bVar11 != 0x3a)))) {
      local_1250 = CONCAT71((int7)((ulong)in_RCX >> 8),bVar11 == 0x22);
      if (bVar11 == 0x22) {
        pbVar13 = pbVar13 + 1;
        sVar4 = strlen((char *)pbVar13);
        pbVar9 = (byte *)malloc(sVar4 + 1);
        pbVar12 = pbVar9;
        if (pbVar9 != (byte *)0x0) {
          do {
            bVar11 = *pbVar13;
            pbVar13 = pbVar13 + 1;
            do {
              if (bVar11 != 0x5c) {
                if ((bVar11 != 0) && (bVar11 != 0x22)) goto switchD_001189f2_caseD_6f;
                *pbVar12 = 0;
                goto LAB_00118aa4;
              }
              bVar11 = *pbVar13;
              pbVar13 = pbVar13 + 1;
            } while (bVar11 == 0);
            switch(bVar11) {
            case 0x6e:
              bVar11 = 10;
              break;
            case 0x72:
              bVar11 = 0xd;
              break;
            case 0x74:
              bVar11 = 9;
              break;
            case 0x76:
              bVar11 = 0xb;
            }
switchD_001189f2_caseD_6f:
            *pbVar12 = bVar11;
            pbVar12 = pbVar12 + 1;
          } while( true );
        }
        free(__s_00);
        iVar3 = 1;
LAB_00118c20:
        if (__stream == _stdin) {
          return iVar3;
        }
        fclose(__stream);
        return iVar3;
      }
      goto LAB_00118a27;
    }
  }
  pbVar13 = pbVar13 + 1;
  in_RCX = pOVar10;
  goto LAB_00118954;
LAB_00118986:
  pOVar10 = (OperationConfig *)0x0;
LAB_00118a27:
  do {
    local_1248 = __stream;
    if ((char)pOVar10 == '\0') goto LAB_00118a83;
    iVar3 = Curl_isspace((int)pOVar10);
    if (iVar3 != 0) {
      if (*pbVar9 != 0) {
        *pbVar9 = 0;
        break;
      }
      goto LAB_00118a83;
    }
    pOVar10 = (OperationConfig *)(ulong)pbVar9[1];
    pbVar12 = pbVar12 + 1;
    pbVar9 = pbVar9 + 1;
    __stream = local_1248;
  } while( true );
  while( true ) {
    iVar3 = Curl_isspace((uint)*pbVar9);
    pbVar12 = pbVar9 + 1;
    if (iVar3 == 0) break;
    pbVar9 = pbVar12;
    if (*pbVar9 == 0) goto LAB_00118a83;
  }
  if ((0x23 < (ulong)*pbVar9) || ((0x800002401U >> ((ulong)*pbVar9 & 0x3f) & 1) == 0)) {
    warnf(local_1268->global,
          "%s:%d: warning: \'%s\' uses unquoted white space in the line that may cause side-effects!\n"
          ,local_1258,(ulong)local_125c,pbVar7);
  }
LAB_00118a83:
  local_1250 = 0;
  pbVar9 = (byte *)0x0;
  __stream = local_1248;
  if (*pbVar13 != 0) {
    pbVar9 = pbVar13;
  }
LAB_00118aa4:
  global = (GlobalConfig *)local_1240;
  in_RCX = local_1240;
  res = getparameter((char *)pbVar7,(char *)pbVar9,&usedarg,(GlobalConfig *)local_1240,local_1268);
  if ((pbVar9 == (byte *)0x0) || (res != PARAM_OK)) {
    if (res == PARAM_OK) goto LAB_00118bcb;
    if (res == PARAM_NEXT_OPERATION) {
      if ((local_1268->url_list == (getout *)0x0) || (local_1268->url_list->url == (char *)0x0))
      goto LAB_00118bcb;
      pOVar10 = (OperationConfig *)malloc(0x4a0);
      local_1268->next = pOVar10;
      res = PARAM_NO_MEM;
      if (pOVar10 != (OperationConfig *)0x0) {
        config_init(pOVar10);
        in_RCX = local_1268->next;
        in_RCX->easy = ((OperationConfig *)global)->easy;
        in_RCX->global = global;
        *(OperationConfig **)&((OperationConfig *)global)->proto_present = in_RCX;
        in_RCX->prev = local_1268;
        local_1268 = in_RCX;
        goto LAB_00118bcb;
      }
    }
  }
  else if ((*pbVar9 == 0) || (res = PARAM_GOT_EXTRA_PARAMETER, usedarg != false)) goto LAB_00118bcb;
  if ((*local_1258 == '-') && (local_1258[1] == '\0')) {
    local_1258 = "<stdin>";
  }
  in_RCX = (OperationConfig *)(ulong)(res - PARAM_GOT_EXTRA_PARAMETER);
  if (res - PARAM_GOT_EXTRA_PARAMETER < 0xfffffffc) {
    pcVar5 = param2text(res);
    in_RCX = (OperationConfig *)(ulong)local_125c;
    warnf(local_1268->global,"%s:%d: warning: \'%s\' %s\n",local_1258,in_RCX,pbVar7,pcVar5);
  }
LAB_00118bcb:
  if ((char)local_1250 != '\0') {
    free(pbVar9);
  }
LAB_001188f5:
  free(__s_00);
  goto LAB_00118825;
}

Assistant:

int parseconfig(const char *filename, struct GlobalConfig *global)
{
  FILE *file;
  char filebuffer[512];
  bool usedarg = FALSE;
  int rc = 0;
  struct OperationConfig *operation = global->first;

  if(!filename || !*filename) {
    /* NULL or no file name attempts to load .curlrc from the homedir! */

#ifndef __AMIGA__
    char *home = homedir();    /* portable homedir finder */
    filename = CURLRC;   /* sensible default */
    if(home) {
      if(strlen(home) < (sizeof(filebuffer) - strlen(CURLRC))) {
        snprintf(filebuffer, sizeof(filebuffer),
                 "%s%s%s", home, DIR_CHAR, CURLRC);

#ifdef WIN32
        /* Check if the file exists - if not, try CURLRC in the same
         * directory as our executable
         */
        file = fopen(filebuffer, FOPEN_READTEXT);
        if(file != NULL) {
          fclose(file);
          filename = filebuffer;
        }
        else {
          /* Get the filename of our executable. GetModuleFileName is
           * already declared via inclusions done in setup header file.
           * We assume that we are using the ASCII version here.
           */
          int n = GetModuleFileNameA(0, filebuffer, sizeof(filebuffer));
          if(n > 0 && n < (int)sizeof(filebuffer)) {
            /* We got a valid filename - get the directory part */
            char *lastdirchar = strrchr(filebuffer, '\\');
            if(lastdirchar) {
              size_t remaining;
              *lastdirchar = 0;
              /* If we have enough space, build the RC filename */
              remaining = sizeof(filebuffer) - strlen(filebuffer);
              if(strlen(CURLRC) < remaining - 1) {
                snprintf(lastdirchar, remaining,
                         "%s%s", DIR_CHAR, CURLRC);
                /* Don't bother checking if it exists - we do
                 * that later
                 */
                filename = filebuffer;
              }
            }
          }
        }
#else /* WIN32 */
        filename = filebuffer;
#endif /* WIN32 */
      }
      Curl_safefree(home); /* we've used it, now free it */
    }

# else /* __AMIGA__ */
    /* On AmigaOS all the config files are into env:
     */
    filename = "ENV:" CURLRC;

#endif
  }

  if(strcmp(filename, "-"))
    file = fopen(filename, FOPEN_READTEXT);
  else
    file = stdin;

  if(file) {
    char *line;
    char *aline;
    char *option;
    char *param;
    int lineno = 0;
    bool dashed_option;

    while(NULL != (aline = my_get_line(file))) {
      int res;
      bool alloced_param = FALSE;
      lineno++;
      line = aline;

      /* line with # in the first non-blank column is a comment! */
      while(*line && ISSPACE(*line))
        line++;

      switch(*line) {
      case '#':
      case '/':
      case '\r':
      case '\n':
      case '*':
      case '\0':
        Curl_safefree(aline);
        continue;
      }

      /* the option keywords starts here */
      option = line;

      /* the option starts with a dash? */
      dashed_option = option[0]=='-'?TRUE:FALSE;

      while(*line && !ISSPACE(*line) && !ISSEP(*line, dashed_option))
        line++;
      /* ... and has ended here */

      if(*line)
        *line++ = '\0'; /* zero terminate, we have a local copy of the data */

#ifdef DEBUG_CONFIG
      fprintf(stderr, "GOT: %s\n", option);
#endif

      /* pass spaces and separator(s) */
      while(*line && (ISSPACE(*line) || ISSEP(*line, dashed_option)))
        line++;

      /* the parameter starts here (unless quoted) */
      if(*line == '\"') {
        /* quoted parameter, do the quote dance */
        line++;
        param = malloc(strlen(line) + 1); /* parameter */
        if(!param) {
          /* out of memory */
          Curl_safefree(aline);
          rc = 1;
          break;
        }
        alloced_param = TRUE;
        (void)unslashquote(line, param);
      }
      else {
        param = line; /* parameter starts here */
        while(*line && !ISSPACE(*line))
          line++;

        if(*line) {
          *line = '\0'; /* zero terminate */

          /* to detect mistakes better, see if there's data following */
          line++;
          /* pass all spaces */
          while(*line && ISSPACE(*line))
            line++;

          switch(*line) {
          case '\0':
          case '\r':
          case '\n':
          case '#': /* comment */
            break;
          default:
            warnf(operation->global, "%s:%d: warning: '%s' uses unquoted "
                  "white space in the line that may cause side-effects!\n",
                  filename, lineno, option);
          }
        }
        if(!*param)
          /* do this so getparameter can check for required parameters.
             Otherwise it always thinks there's a parameter. */
          param = NULL;
      }

#ifdef DEBUG_CONFIG
      fprintf(stderr, "PARAM: \"%s\"\n",(param ? param : "(null)"));
#endif
      res = getparameter(option, param, &usedarg, global, operation);

      if(!res && param && *param && !usedarg)
        /* we passed in a parameter that wasn't used! */
        res = PARAM_GOT_EXTRA_PARAMETER;

      if(res == PARAM_NEXT_OPERATION) {
        if(operation->url_list && operation->url_list->url) {
          /* Allocate the next config */
          operation->next = malloc(sizeof(struct OperationConfig));
          if(operation->next) {
            /* Initialise the newly created config */
            config_init(operation->next);

            /* Copy the easy handle */
            operation->next->easy = global->easy;

            /* Set the global config pointer */
            operation->next->global = global;

            /* Update the last operation pointer */
            global->last = operation->next;

            /* Move onto the new config */
            operation->next->prev = operation;
            operation = operation->next;
          }
          else
            res = PARAM_NO_MEM;
        }
      }

      if(res != PARAM_OK && res != PARAM_NEXT_OPERATION) {
        /* the help request isn't really an error */
        if(!strcmp(filename, "-")) {
          filename = "<stdin>";
        }
        if(res != PARAM_HELP_REQUESTED &&
           res != PARAM_MANUAL_REQUESTED &&
           res != PARAM_VERSION_INFO_REQUESTED &&
           res != PARAM_ENGINES_REQUESTED) {
          const char *reason = param2text(res);
          warnf(operation->global, "%s:%d: warning: '%s' %s\n",
                filename, lineno, option, reason);
        }
      }

      if(alloced_param)
        Curl_safefree(param);

      Curl_safefree(aline);
    }
    if(file != stdin)
      fclose(file);
  }
  else
    rc = 1; /* couldn't open the file */

  return rc;
}